

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prog.cc
# Opt level: O2

void __thiscall re2::Prog::ComputeByteMap(Prog *this)

{
  Inst *this_00;
  byte bVar1;
  int iVar2;
  bool bVar3;
  bool bVar4;
  int i;
  uint uVar5;
  uint uVar6;
  int iVar7;
  EmptyOp EVar8;
  ulong uVar9;
  uint8 uVar10;
  int id;
  long lVar11;
  int iVar12;
  Bitmap<256> local_50;
  
  Bitmap<256>::Reset(&local_50);
  lVar11 = 0;
  bVar1 = 0;
  do {
    if (this->size_ <= lVar11) {
      uVar10 = '\0';
      uVar5 = 0;
      for (uVar9 = 0; uVar9 != 0x100; uVar9 = uVar9 + 1) {
        if ((uVar9 & 0x1f) == 0) {
          uVar5 = local_50.w_[uVar9 >> 5 & 0x7ffffff];
        }
        this->bytemap_[uVar9] = uVar10;
        uVar10 = uVar10 + ((byte)uVar5 & 1);
        uVar5 = uVar5 >> 1;
      }
      this->bytemap_range_ = this->bytemap_[0xff] + 1;
      return;
    }
    this_00 = this->inst_ + lVar11;
    uVar5 = this_00->out_opcode_ & 7;
    if (uVar5 == 4) {
      EVar8 = Inst::empty(this_00);
      if ((EVar8 & (kEmptyEndLine|kEmptyBeginLine)) != 0) {
        local_50.w_[0]._1_1_ = local_50.w_[0]._1_1_ | 6;
      }
      EVar8 = Inst::empty(this_00);
      if (!(bool)((EVar8 & (kEmptyNonWordBoundary|kEmptyWordBoundary)) == 0 | bVar1)) {
        iVar7 = 0;
        while (iVar12 = iVar7, iVar7 < 0x100) {
          do {
            iVar2 = iVar12;
            if (iVar2 == 0xff) {
              iVar12 = 0x100;
              break;
            }
            iVar12 = iVar2 + 1;
            bVar3 = IsWordChar((uint8)iVar7);
            bVar4 = IsWordChar((uint8)iVar12);
          } while (bVar3 == bVar4);
          if (0 < iVar7) {
            local_50.w_[iVar7 - 1U >> 5] =
                 local_50.w_[iVar7 - 1U >> 5] | 1 << ((byte)(iVar7 - 1U) & 0x1f);
          }
          local_50.w_[iVar2 >> 5] = local_50.w_[iVar2 >> 5] | 1 << ((byte)iVar2 & 0x1f);
          iVar7 = iVar12;
        }
        bVar1 = 1;
      }
    }
    else if (uVar5 == 2) {
      uVar5 = Inst::lo(this_00);
      uVar6 = Inst::hi(this_00);
      if (0 < (int)uVar5) {
        local_50.w_[uVar5 - 1 >> 5] = local_50.w_[uVar5 - 1 >> 5] | 1 << ((byte)(uVar5 - 1) & 0x1f);
      }
      local_50.w_[(int)uVar6 >> 5] = local_50.w_[(int)uVar6 >> 5] | 1 << ((byte)uVar6 & 0x1f);
      iVar7 = Inst::foldcase(this_00);
      if (((0x60 < (int)uVar6) && ((int)uVar5 < 0x7b)) && (iVar7 != 0)) {
        if ((int)uVar5 < 0x62) {
          uVar5 = 0x61;
        }
        if (0x79 < uVar6) {
          uVar6 = 0x7a;
        }
        if (uVar5 <= uVar6) {
          local_50.w_[uVar5 - 0x21 >> 5] =
               local_50.w_[uVar5 - 0x21 >> 5] | 1 << ((byte)(uVar5 - 0x21) & 0x1f);
          local_50.w_[uVar6 - 0x20 >> 5] =
               local_50.w_[uVar6 - 0x20 >> 5] | 1 << ((byte)uVar6 & 0x1f);
        }
      }
    }
    lVar11 = lVar11 + 1;
  } while( true );
}

Assistant:

void Prog::ComputeByteMap() {
  // Fill in byte map with byte classes for the program.
  // Ranges of bytes that are treated indistinguishably
  // are mapped to a single byte class.
  Bitmap<256> v;

  // Don't repeat the work for \b and \B.
  bool done_word_boundaries = false;

  for (int id = 0; id < static_cast<int>(size()); id++) {
    Inst* ip = inst(id);
    if (ip->opcode() == kInstByteRange) {
      int lo = ip->lo();
      int hi = ip->hi();
      if (0 < lo)
        v.Set(lo - 1);
      v.Set(hi);
      if (ip->foldcase() && lo <= 'z' && hi >= 'a') {
        if (lo < 'a')
          lo = 'a';
        if (hi > 'z')
          hi = 'z';
        if (lo <= hi) {
          v.Set(lo + 'A' - 'a' - 1);
          v.Set(hi + 'A' - 'a');
        }
      }
    } else if (ip->opcode() == kInstEmptyWidth) {
      if (ip->empty() & (kEmptyBeginLine|kEmptyEndLine)) {
        v.Set('\n' - 1);
        v.Set('\n');
      }
      if (ip->empty() & (kEmptyWordBoundary|kEmptyNonWordBoundary)) {
        if (done_word_boundaries)
          continue;
        int j;
        for (int i = 0; i < 256; i = j) {
          for (j = i + 1; j < 256 &&
                          Prog::IsWordChar(static_cast<uint8>(i)) ==
                              Prog::IsWordChar(static_cast<uint8>(j));
               j++)
            ;
          if (0 < i)
            v.Set(i - 1);
          v.Set(j - 1);
        }
        done_word_boundaries = true;
      }
    }
  }

  COMPILE_ASSERT(8*sizeof(v.Word(0)) == 32, wordsize);
  uint8 n = 0;
  uint32 bits = 0;
  for (int i = 0; i < 256; i++) {
    if ((i & 31) == 0)
      bits = v.Word(i >> 5);
    bytemap_[i] = n;
    n += bits & 1;
    bits >>= 1;
  }
  bytemap_range_ = bytemap_[255] + 1;

  if (0) {  // For debugging: use trivial byte map.
    for (int i = 0; i < 256; i++)
      bytemap_[i] = static_cast<uint8>(i);
    bytemap_range_ = 256;
    LOG(INFO) << "Using trivial bytemap.";
  }
}